

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

exr_result_t DwaCompressor_compress(DwaCompressor *me)

{
  uint8_t uVar1;
  exr_coding_channel_info_t *peVar2;
  exr_result_t eVar3;
  CscChannelSet *pCVar4;
  ChannelData *pCVar5;
  size_t __n;
  uint64_t uVar6;
  DwaCompressor *in_RDI;
  size_t dataBytes;
  size_t compBytes_1;
  size_t uncompBytes;
  size_t compBytes;
  size_t destLen;
  size_t sourceLen;
  size_t outDataSize;
  size_t outSize;
  size_t y_2;
  DctCoderChannelData *dcd_1;
  size_t scanlineSize;
  int byte;
  int x;
  uint8_t *row;
  size_t y_1;
  DctCoderChannelData *dcd;
  unsigned_short *nonlinearLut;
  LossyDctEncoder enc_1;
  exr_coding_channel_info_t *pchan;
  ChannelData *cd_1;
  size_t chan_1;
  CscChannelSet *cset;
  LossyDctEncoder enc;
  size_t csc;
  exr_coding_channel_info_t *chan;
  ChannelData *cd;
  size_t c_1;
  int y;
  uint8_t *inDataPtr;
  size_t c;
  uint8_t *outDataPtr;
  uint8_t *packedDcEnd;
  uint8_t *packedAcEnd;
  uint64_t *acCompression;
  uint64_t *totalDcUncompressedCount;
  uint64_t *totalAcUncompressedCount;
  uint64_t *rleRawSize;
  uint64_t *rleUncompressedSize;
  uint64_t *rleCompressedSize;
  uint64_t *dcCompressedSize;
  uint64_t *acCompressedSize;
  uint64_t *unknownCompressedSize;
  uint64_t *unknownUncompressedSize;
  uint64_t *version;
  uint64_t *sizes;
  size_t readHere;
  int fileVersion;
  uint64_t nAvail;
  uint64_t nWritten;
  uint64_t outBufferSize;
  uint8_t *outPtr;
  exr_result_t rv;
  uint16_t *in_stack_fffffffffffff938;
  int32_t in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  int32_t in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  DctCoderChannelData *in_stack_fffffffffffff950;
  uint8_t *puVar7;
  DctCoderChannelData *in_stack_fffffffffffff958;
  void *out;
  LossyDctEncoder *in_stack_fffffffffffff960;
  long *in_bytes;
  undefined4 in_stack_fffffffffffff968;
  float in_stack_fffffffffffff96c;
  int level;
  LossyDctEncoder *in_stack_fffffffffffff970;
  void **in_stack_fffffffffffff978;
  uint64_t *in_stack_fffffffffffff980;
  exr_transcoding_pipeline_buffer_id_t bufid;
  exr_encode_pipeline_t *in_stack_fffffffffffff988;
  uint8_t **in_stack_fffffffffffff990;
  DwaCompressor *in_stack_fffffffffffff998;
  void *in_stack_fffffffffffff9b0;
  long *in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  CompressorScheme in_stack_fffffffffffff9c4;
  uint64_t in_stack_fffffffffffff9c8;
  void *in_stack_fffffffffffff9d0;
  uint64_t *in_stack_fffffffffffff9d8;
  long local_620;
  long local_618;
  uint64_t in_stack_fffffffffffff9f0;
  size_t *in_stack_fffffffffffffa00;
  DwaCompressor *in_stack_fffffffffffffa08;
  ulong uVar8;
  int local_5e0;
  int local_5dc;
  uint8_t *local_5d8;
  ulong local_5d0;
  int local_5a0;
  int local_59c;
  LossyDctEncoder *in_stack_fffffffffffffae8;
  ulong local_358;
  LossyDctEncoder local_348;
  ulong local_f8;
  exr_coding_channel_info_t *local_f0;
  ChannelData *local_e8;
  ulong local_e0;
  int local_d4;
  void *local_d0;
  ulong local_c8;
  long *local_c0;
  uint8_t *local_b8;
  uint8_t *local_b0;
  ulong *local_a8;
  long *local_a0;
  long *local_98;
  uint64_t *local_90;
  uint64_t *local_88;
  long *local_80;
  long *local_78;
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  undefined8 local_48;
  int local_3c;
  ulong local_38;
  ulong local_30;
  undefined8 local_28;
  long *local_20;
  exr_result_t local_14;
  DwaCompressor *local_10;
  exr_result_t local_4;
  
  local_28 = 0;
  local_30 = 0;
  local_3c = 2;
  in_RDI->_channelRules = sDefaultChannelRules;
  in_RDI->_channelRuleCount = 0xf;
  local_48 = 0;
  local_10 = in_RDI;
  local_14 = DwaCompressor_initializeBuffers(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  local_28 = local_48;
  local_38 = local_10->_encode->compressed_alloc_size;
  if (local_38 < 0x58) {
    local_4 = 1;
  }
  else {
    local_14 = internal_encode_alloc_buffer
                         (in_stack_fffffffffffff988,
                          (exr_transcoding_pipeline_buffer_id_t)
                          ((ulong)in_stack_fffffffffffff980 >> 0x20),in_stack_fffffffffffff978,
                          (size_t *)in_stack_fffffffffffff970,
                          CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
    local_4 = local_14;
    if (local_14 == 0) {
      local_38 = local_28;
      local_50 = (long *)local_10->_encode->compressed_buffer;
      memset(local_50,0,local_10->_encode->compressed_alloc_size);
      local_58 = local_50;
      local_60 = local_50 + 1;
      local_68 = local_50 + 2;
      local_70 = local_50 + 3;
      local_78 = local_50 + 4;
      local_80 = local_50 + 5;
      local_88 = (uint64_t *)(local_50 + 6);
      local_90 = (uint64_t *)(local_50 + 7);
      local_98 = local_50 + 8;
      local_a0 = local_50 + 9;
      local_a8 = (ulong *)(local_50 + 10);
      local_b0 = (uint8_t *)0x0;
      local_b8 = (uint8_t *)0x0;
      local_20 = local_50 + 0xb;
      if ((local_14 == 0) && (1 < local_3c)) {
        local_14 = DwaCompressor_writeRelevantChannelRules
                             (in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                              (uint64_t)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
      }
      local_30 = local_30 + 0x58;
      if ((local_14 == 0) && (local_30 < local_10->_encode->compressed_alloc_size)) {
        local_c0 = local_20;
        if (local_10->_packedAcBuffer != (uint8_t *)0x0) {
          local_b0 = local_10->_packedAcBuffer;
        }
        if (local_10->_packedDcBuffer != (uint8_t *)0x0) {
          local_b8 = local_10->_packedDcBuffer;
        }
        *local_58 = (long)local_3c;
        *local_a8 = (ulong)local_10->_acCompression;
        local_14 = DwaCompressor_setupChannelData(local_10);
        local_4 = local_14;
        if (local_14 == 0) {
          for (local_c8 = 0; local_c8 < (ulong)(long)local_10->_numChannels; local_c8 = local_c8 + 1
              ) {
            local_10->_channelData[local_c8].processed = 0;
          }
          local_d0 = local_10->_encode->packed_buffer;
          for (local_d4 = local_10->_min[1]; local_d4 <= local_10->_max[1]; local_d4 = local_d4 + 1)
          {
            for (local_e0 = 0; local_e0 < (ulong)(long)local_10->_numChannels;
                local_e0 = local_e0 + 1) {
              local_e8 = local_10->_channelData + local_e0;
              local_f0 = local_e8->chan;
              if (local_d4 % local_f0->y_samples == 0) {
                eVar3 = DctCoderChannelData_push_row
                                  (in_stack_fffffffffffff958,(uint8_t *)in_stack_fffffffffffff950);
                if (eVar3 != 0) {
                  return eVar3;
                }
                local_d0 = (void *)((long)local_d0 +
                                   (long)(local_f0->width * (int)local_f0->bytes_per_element));
                local_14 = 0;
              }
            }
          }
          for (local_f8 = 0; local_f8 < (ulong)(long)local_10->_numCscChannelSets;
              local_f8 = local_f8 + 1) {
            pCVar4 = local_10->_cscChannelSets + local_f8;
            in_stack_fffffffffffff940 = (local_10->_channelData[pCVar4->idx[0]].chan)->width;
            in_stack_fffffffffffff948 = (local_10->_channelData[pCVar4->idx[0]].chan)->height;
            in_stack_fffffffffffff938 = (uint16_t *)0x0;
            local_14 = LossyDctEncoderCsc_construct
                                 (in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
                                  (DctCoderChannelData *)in_stack_fffffffffffff960,
                                  in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                                  (uint8_t *)
                                  CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                                  (uint8_t *)
                                  CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                                  (uint16_t *)in_stack_fffffffffffff980,
                                  (int)in_stack_fffffffffffff988,(int)in_stack_fffffffffffff990);
            if (local_14 == 0) {
              local_14 = LossyDctEncoder_execute(in_stack_fffffffffffffae8);
            }
            *local_98 = *local_98 + (long)local_348._numAcComp;
            *local_a0 = *local_a0 + (long)local_348._numDcComp;
            local_b0 = local_b0 + (long)local_348._numAcComp * 2;
            local_b8 = local_b8 + (long)local_348._numDcComp * 2;
            local_10->_channelData[pCVar4->idx[0]].processed = 1;
            local_10->_channelData[pCVar4->idx[1]].processed = 1;
            local_10->_channelData[pCVar4->idx[2]].processed = 1;
            LossyDctEncoder_destroy(&local_348);
            if (local_14 != 0) {
              return local_14;
            }
          }
          for (local_358 = 0;
              bufid = (exr_transcoding_pipeline_buffer_id_t)
                      ((ulong)in_stack_fffffffffffff980 >> 0x20),
              local_358 < (ulong)(long)local_10->_numChannels; local_358 = local_358 + 1) {
            pCVar5 = local_10->_channelData + local_358;
            peVar2 = pCVar5->chan;
            if (pCVar5->processed == 0) {
              in_stack_fffffffffffff9c4 = pCVar5->compression;
              if (in_stack_fffffffffffff9c4 == UNKNOWN) {
                __n = (size_t)(peVar2->width * (int)peVar2->bytes_per_element);
                for (uVar8 = 0; uVar8 < (pCVar5->_dctData)._size; uVar8 = uVar8 + 1) {
                  memcpy(pCVar5->planarUncBufferEnd,(pCVar5->_dctData)._rows[uVar8],__n);
                  pCVar5->planarUncBufferEnd = pCVar5->planarUncBufferEnd + __n;
                }
                *local_60 = pCVar5->planarUncSize + *local_60;
              }
              else if (in_stack_fffffffffffff9c4 == LOSSY_DCT) {
                in_stack_fffffffffffff938 =
                     (uint16_t *)
                     CONCAT44((int)((ulong)in_stack_fffffffffffff938 >> 0x20),peVar2->height);
                local_14 = LossyDctEncoder_construct
                                     (in_stack_fffffffffffff960,
                                      (float)((ulong)in_stack_fffffffffffff958 >> 0x20),
                                      in_stack_fffffffffffff950,
                                      (uint8_t *)
                                      CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                                      (uint8_t *)
                                      CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                                      in_stack_fffffffffffff938,0,(int)in_stack_fffffffffffff970);
                if (local_14 == 0) {
                  local_14 = LossyDctEncoder_execute(in_stack_fffffffffffffae8);
                }
                *local_98 = *local_98 + (long)local_5a0;
                *local_a0 = *local_a0 + (long)local_59c;
                local_b0 = local_b0 + (long)local_5a0 * 2;
                local_b8 = local_b8 + (long)local_59c * 2;
                LossyDctEncoder_destroy((LossyDctEncoder *)&stack0xfffffffffffffa48);
                if (local_14 != 0) {
                  return local_14;
                }
              }
              else {
                if (in_stack_fffffffffffff9c4 != RLE) {
                  return 3;
                }
                for (local_5d0 = 0; local_5d0 < (pCVar5->_dctData)._size; local_5d0 = local_5d0 + 1)
                {
                  local_5d8 = (pCVar5->_dctData)._rows[local_5d0];
                  for (local_5dc = 0; local_5dc < peVar2->width; local_5dc = local_5dc + 1) {
                    for (local_5e0 = 0; local_5e0 < peVar2->bytes_per_element;
                        local_5e0 = local_5e0 + 1) {
                      uVar1 = *local_5d8;
                      puVar7 = pCVar5->planarUncRleEnd[local_5e0];
                      pCVar5->planarUncRleEnd[local_5e0] = puVar7 + 1;
                      *puVar7 = uVar1;
                      local_5d8 = local_5d8 + 1;
                    }
                  }
                  *local_90 = (long)(peVar2->width * (int)peVar2->bytes_per_element) + *local_90;
                }
              }
              pCVar5->processed = 1;
            }
          }
          if (*local_60 != 0) {
            in_stack_fffffffffffff9b0 = (void *)*local_60;
            in_stack_fffffffffffff9b8 = local_c0;
            exr_compress_max_buffer_size
                      (CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            eVar3 = exr_compress_buffer((int)in_stack_fffffffffffff970,
                                        (void *)CONCAT44(in_stack_fffffffffffff96c,
                                                         in_stack_fffffffffffff968),
                                        (size_t)in_stack_fffffffffffff960,in_stack_fffffffffffff958,
                                        (size_t)in_stack_fffffffffffff950,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948
                                                ));
            if (eVar3 != 0) {
              return eVar3;
            }
            local_c0 = (long *)((long)in_stack_fffffffffffffa00 + (long)local_c0);
            *local_68 = (long)in_stack_fffffffffffffa00;
            local_30 = (long)in_stack_fffffffffffffa00 + local_30;
            local_14 = 0;
          }
          if (*local_98 != 0) {
            if (local_10->_acCompression == STATIC_HUFFMAN) {
              local_14 = internal_huf_compress
                                   (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                                    in_stack_fffffffffffff9c8,
                                    (uint16_t *)
                                    CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                                    (uint64_t)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                                    in_stack_fffffffffffff9f0);
              if (local_14 != 0) {
                if (local_14 != 4) {
                  return local_14;
                }
                memcpy(local_10->_encode->compressed_buffer,local_10->_encode->packed_buffer,
                       local_10->_encode->packed_alloc_size);
                local_10->_encode->compressed_bytes = local_10->_encode->packed_alloc_size;
                return 0;
              }
            }
            else {
              if (local_10->_acCompression != DEFLATE) {
                return 3;
              }
              in_stack_fffffffffffff988 = (exr_encode_pipeline_t *)local_10->_packedAcBuffer;
              exr_compress_max_buffer_size
                        (CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
              eVar3 = exr_compress_buffer((int)in_stack_fffffffffffff970,
                                          (void *)CONCAT44(in_stack_fffffffffffff96c,
                                                           in_stack_fffffffffffff968),
                                          (size_t)in_stack_fffffffffffff960,
                                          in_stack_fffffffffffff958,
                                          (size_t)in_stack_fffffffffffff950,
                                          (size_t *)
                                          CONCAT44(in_stack_fffffffffffff94c,
                                                   in_stack_fffffffffffff948));
              if (eVar3 != 0) {
                return eVar3;
              }
              *local_70 = local_618;
              local_14 = 0;
            }
            local_c0 = (long *)(*local_70 + (long)local_c0);
            local_30 = *local_70 + local_30;
          }
          if (*local_a0 != 0) {
            uVar6 = *local_a0 << 1;
            local_14 = internal_encode_alloc_buffer
                                 (in_stack_fffffffffffff988,bufid,in_stack_fffffffffffff978,
                                  (size_t *)in_stack_fffffffffffff970,
                                  CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
            if (local_14 != 0) {
              return local_14;
            }
            internal_zip_deconstruct_bytes
                      ((uint8_t *)local_10->_encode->scratch_buffer_1,local_10->_packedDcBuffer,
                       uVar6);
            in_stack_fffffffffffff96c = (float)local_10->_zipLevel;
            in_stack_fffffffffffff970 = (LossyDctEncoder *)local_10->_encode->scratch_buffer_1;
            exr_compress_max_buffer_size
                      (CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            eVar3 = exr_compress_buffer((int)in_stack_fffffffffffff970,
                                        (void *)CONCAT44(in_stack_fffffffffffff96c,
                                                         in_stack_fffffffffffff968),
                                        (size_t)in_stack_fffffffffffff960,in_stack_fffffffffffff958,
                                        (size_t)in_stack_fffffffffffff950,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948
                                                ));
            if (eVar3 != 0) {
              return eVar3;
            }
            *local_78 = local_620;
            local_c0 = (long *)(local_620 + (long)local_c0);
            local_30 = local_620 + local_30;
            local_14 = 0;
          }
          level = (int)in_stack_fffffffffffff970;
          if (*local_90 != 0) {
            uVar6 = internal_rle_compress
                              (local_10->_rleBuffer,local_10->_rleBufferSize,
                               local_10->_planarUncBuffer[2],*local_90);
            *local_88 = uVar6;
            puVar7 = local_10->_rleBuffer;
            out = (void *)*local_88;
            in_bytes = local_c0;
            exr_compress_max_buffer_size
                      (CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
            eVar3 = exr_compress_buffer(level,(void *)CONCAT44(in_stack_fffffffffffff96c,
                                                               in_stack_fffffffffffff968),
                                        (size_t)in_bytes,out,(size_t)puVar7,
                                        (size_t *)
                                        CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948
                                                ));
            if (eVar3 != 0) {
              return eVar3;
            }
            *local_80 = (long)in_stack_fffffffffffff9d0;
            local_c0 = (long *)((long)in_stack_fffffffffffff9d0 + (long)local_c0);
            local_30 = (long)in_stack_fffffffffffff9d0 + local_30;
            local_14 = 0;
          }
          priv_from_native64(local_50,0xb);
          if (local_30 == (long)local_c0 - (long)local_10->_encode->compressed_buffer) {
            if (local_30 < local_10->_encode->packed_bytes) {
              local_10->_encode->compressed_bytes = local_30;
            }
            else {
              memcpy(local_10->_encode->compressed_buffer,local_10->_encode->packed_buffer,
                     local_10->_encode->packed_bytes);
              local_10->_encode->compressed_bytes = local_10->_encode->packed_bytes;
            }
            local_4 = local_14;
          }
          else {
            local_4 = 0x17;
          }
        }
      }
      else {
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
DwaCompressor_compress (DwaCompressor* me)
{
    exr_result_t rv;
    uint8_t*     outPtr;
    uint64_t     outBufferSize = 0;
    uint64_t     nWritten      = 0;
    uint64_t     nAvail;
    int          fileVersion = 2;

    // Starting with 2, we write the channel
    // classification rules into the file
    if (fileVersion < 2)
    {
        me->_channelRules = sLegacyChannelRules;
        me->_channelRuleCount =
            sizeof (sLegacyChannelRules) / sizeof (Classifier);
    }
    else
    {
        me->_channelRules = sDefaultChannelRules;
        me->_channelRuleCount =
            sizeof (sDefaultChannelRules) / sizeof (Classifier);
    }

    size_t readHere = 0;
    rv = DwaCompressor_initializeBuffers (me, &readHere);
    outBufferSize = readHere;

    nAvail = me->_encode->compressed_alloc_size;
    if (nAvail < (NUM_SIZES_SINGLE * sizeof (uint64_t)))
        return EXR_ERR_OUT_OF_MEMORY;

    rv = internal_encode_alloc_buffer (
        me->_encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(me->_encode->compressed_buffer),
        &(me->_encode->compressed_alloc_size),
        outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nAvail          = outBufferSize;
    uint64_t* sizes = (uint64_t*) me->_encode->compressed_buffer;

    //
    // Zero all the numbers in the chunk header
    //
    //    memset (sizes, 0, NUM_SIZES_SINGLE * sizeof (uint64_t));
    memset (sizes, 0, me->_encode->compressed_alloc_size);

#define OBIDX(x) (uint64_t*) (sizes + x)

    uint64_t* version                 = OBIDX (VERSION);
    uint64_t* unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    uint64_t* unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    uint64_t* acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    uint64_t* dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    uint64_t* rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    uint64_t* rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    uint64_t* rleRawSize              = OBIDX (RLE_RAW_SIZE);

    uint64_t* totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    uint64_t* totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    uint64_t* acCompression = OBIDX (AC_COMPRESSION);
    uint8_t*  packedAcEnd   = NULL;
    uint8_t*  packedDcEnd   = NULL;

    // Now write in the channel rules...
    outPtr = (uint8_t*) (sizes + NUM_SIZES_SINGLE);
    if (rv == EXR_ERR_SUCCESS && fileVersion >= 2)
    {
        rv = DwaCompressor_writeRelevantChannelRules (
            me, &outPtr, nAvail, &nWritten);
    }

    // post add this so we have a 0 value for the relevant channel
    // rules to fill up
    nWritten += NUM_SIZES_SINGLE * sizeof (uint64_t);

    if (rv != EXR_ERR_SUCCESS || nWritten >= me->_encode->compressed_alloc_size)
        return EXR_ERR_OUT_OF_MEMORY;

    uint8_t* outDataPtr   = outPtr;

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and dereferencing
    // a vector will not be a good thing to do.
    //

    if (me->_packedAcBuffer) packedAcEnd = me->_packedAcBuffer;
    if (me->_packedDcBuffer) packedDcEnd = me->_packedDcBuffer;

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;
    *acCompression = me->_acCompression;

    rv = DwaCompressor_setupChannelData (me);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //
    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    uint8_t* inDataPtr = (uint8_t*) me->_encode->packed_buffer;

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (size_t c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (&(cd->_dctData), inDataPtr);
            if (rv != EXR_ERR_SUCCESS) return rv;

            inDataPtr += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Make a pass over all our CSC sets and try to encode them first
    //

    for (size_t csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctEncoder enc;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        rv = LossyDctEncoderCsc_construct (
            &enc,
            me->_dwaCompressionLevel / 100000.f,
            &(me->_channelData[cset->idx[0]]._dctData),
            &(me->_channelData[cset->idx[1]]._dctData),
            &(me->_channelData[cset->idx[2]]._dctData),
            packedAcEnd,
            packedDcEnd,
            dwaCompressorToNonlinear,
            me->_channelData[cset->idx[0]].chan->width,
            me->_channelData[cset->idx[0]].chan->height);

        if (rv == EXR_ERR_SUCCESS) rv = LossyDctEncoder_execute (&enc);

        *totalAcUncompressedCount = *totalAcUncompressedCount + enc._numAcComp;
        *totalDcUncompressedCount = *totalDcUncompressedCount + enc._numDcComp;

        packedAcEnd += enc._numAcComp * sizeof (uint16_t);
        packedDcEnd += enc._numDcComp * sizeof (uint16_t);

        me->_channelData[cset->idx[0]].processed = 1;
        me->_channelData[cset->idx[1]].processed = 1;
        me->_channelData[cset->idx[2]].processed = 1;

        LossyDctEncoder_destroy (&enc);
        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    for (size_t chan = 0; chan < me->_numChannels; ++chan)
    {
        ChannelData*               cd    = &(me->_channelData[chan]);
        exr_coding_channel_info_t* pchan = cd->chan;

        if (cd->processed) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:
                //
                // For LOSSY_DCT, treat this just like the CSC'd case,
                // but only operate on one channel
                //
                {
                    LossyDctEncoder       enc;
                    const unsigned short* nonlinearLut = NULL;

                    if (!pchan->p_linear)
                        nonlinearLut = dwaCompressorToNonlinear;

                    rv = LossyDctEncoder_construct (
                        &enc,
                        me->_dwaCompressionLevel / 100000.f,
                        &(cd->_dctData),
                        packedAcEnd,
                        packedDcEnd,
                        nonlinearLut,
                        pchan->width,
                        pchan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctEncoder_execute (&enc);

                    *totalAcUncompressedCount =
                        *totalAcUncompressedCount + enc._numAcComp;
                    *totalDcUncompressedCount =
                        *totalDcUncompressedCount + enc._numDcComp;

                    packedAcEnd += enc._numAcComp * sizeof (uint16_t);
                    packedDcEnd += enc._numDcComp * sizeof (uint16_t);

                    LossyDctEncoder_destroy (&enc);
                    if (rv != EXR_ERR_SUCCESS) return rv;
                }
                break;

            case RLE: {
                //
                // For RLE, bash the bytes up so that the first bytes of each
                // pixel are contiguous, as are the second bytes, and so on.
                //
                DctCoderChannelData* dcd = &(cd->_dctData);
                for (size_t y = 0; y < dcd->_size; ++y)
                {
                    const uint8_t* row = dcd->_rows[y];

                    for (int x = 0; x < pchan->width; ++x)
                    {
                        for (int byte = 0; byte < pchan->bytes_per_element;
                             ++byte)
                        {
                            *cd->planarUncRleEnd[byte]++ = *row++;
                        }
                    }

                    *rleRawSize += pchan->width * pchan->bytes_per_element;
                }

                break;
            }

            case UNKNOWN:

                //
                // Otherwise, just copy data over verbatim
                //

                {
                    size_t scanlineSize =
                        pchan->width * pchan->bytes_per_element;
                    DctCoderChannelData* dcd = &(cd->_dctData);
                    for (size_t y = 0; y < dcd->_size; ++y)
                    {
                        memcpy (
                            cd->planarUncBufferEnd,
                            dcd->_rows[y],
                            scanlineSize);

                        cd->planarUncBufferEnd += scanlineSize;
                    }

                    *unknownUncompressedSize += cd->planarUncSize;
                }

                break;

            default: return EXR_ERR_INVALID_ARGUMENT;
        }

        cd->processed = DWA_CLASSIFIER_TRUE;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        size_t outSize;

        rv = exr_compress_buffer (
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_planarUncBuffer[UNKNOWN],
            *unknownUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*unknownUncompressedSize),
            &outSize);
        if (rv != EXR_ERR_SUCCESS)
        {
            return rv;
            //throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
        }

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
        nWritten += outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    {
        switch (me->_acCompression)
        {
            case STATIC_HUFFMAN: {
                size_t outDataSize =
                    outBufferSize -
                    (size_t) ((uintptr_t) outDataPtr - (uintptr_t) sizes);

                rv = internal_huf_compress (
                    acCompressedSize,
                    outDataPtr,
                    outDataSize,
                    (const uint16_t*) me->_packedAcBuffer,
                    *totalAcUncompressedCount,
                    me->_encode->scratch_buffer_1,
                    me->_encode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS)
                {
                    if (rv == EXR_ERR_ARGUMENT_OUT_OF_RANGE)
                    {
                        memcpy (
                            me->_encode->compressed_buffer,
                            me->_encode->packed_buffer,
                            me->_encode->packed_alloc_size);
                        me->_encode->compressed_bytes =
                            me->_encode->packed_alloc_size;
                        return EXR_ERR_SUCCESS;
                    }
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data compression (HUF) failed.");
                }
                break;
            }

            case DEFLATE: {
                size_t sourceLen =
                    *totalAcUncompressedCount * sizeof (uint16_t);
                size_t destLen;

                rv = exr_compress_buffer (
                    9, // TODO: use default??? the old call to zlib had 9 hardcoded
                    me->_packedAcBuffer,
                    sourceLen,
                    outDataPtr,
                    exr_compress_max_buffer_size (sourceLen),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS)
                {
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data compression (zlib) failed.");
                }

                *acCompressedSize = destLen;
                break;
            }

            default:
                return EXR_ERR_INVALID_ARGUMENT;
                //assert (false);
        }

        outDataPtr += *acCompressedSize;
        nWritten += *acCompressedSize;
    }

    //
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        size_t compBytes;
        size_t uncompBytes = *totalDcUncompressedCount * sizeof (uint16_t);

        rv = internal_encode_alloc_buffer (
            me->_encode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_encode->scratch_buffer_1),
            &(me->_encode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        internal_zip_deconstruct_bytes (
            (uint8_t*) me->_encode->scratch_buffer_1,
            (const uint8_t*) me->_packedDcBuffer, uncompBytes);

        rv = exr_compress_buffer (
            me->_zipLevel,
            me->_encode->scratch_buffer_1,
            uncompBytes,
            outDataPtr,
            exr_compress_max_buffer_size (uncompBytes),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *dcCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //

    if (*rleRawSize > 0)
    {
        *rleUncompressedSize = internal_rle_compress (
            me->_rleBuffer,
            me->_rleBufferSize,
            me->_planarUncBuffer[RLE],
            *rleRawSize);

        size_t compBytes;
        rv = exr_compress_buffer (
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_rleBuffer,
            *rleUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*rleUncompressedSize),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;
        //throw IEX_NAMESPACE::BaseExc ("Error compressing RLE'd data.");

        *rleCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // Flip the counters to XDR format
    //
    priv_from_native64 (sizes, NUM_SIZES_SINGLE);

    size_t dataBytes =
        (uintptr_t) outDataPtr - (uintptr_t) me->_encode->compressed_buffer;
    if (nWritten != dataBytes) { return EXR_ERR_CORRUPT_CHUNK; }

    if (nWritten >= me->_encode->packed_bytes)
    {
        memcpy (
            me->_encode->compressed_buffer,
            me->_encode->packed_buffer,
            me->_encode->packed_bytes);
        me->_encode->compressed_bytes = me->_encode->packed_bytes;
    }
    else { me->_encode->compressed_bytes = nWritten; }
    return rv;
}